

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DonateStrategy.cpp
# Opt level: O0

void __thiscall
xmrig::DonateStrategy::onLogin(DonateStrategy *this,IClient *param_2,Document *doc,Value *params)

{
  String *this_00;
  char *pcVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  long in_RDI;
  char buf [40];
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 uVar2;
  Data *this_01;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  StringRefType *in_stack_ffffffffffffff68;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff70;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_78;
  GenericStringRef<char> local_68;
  Data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_28;
  
  local_28 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  if ((*(byte *)(in_RDI + 0x24) & 1) == 0) {
    rapidjson::GenericStringRef<char>::GenericStringRef<4u>
              ((GenericStringRef<char> *)&stack0xffffffffffffff68,(char (*) [4])0x27c136);
    std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::operator[]
              ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)(in_RDI + 0xa0),1);
    Pool::url((Pool *)0x23c75e);
    String::toJSON((String *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_ffffffffffffff60,
              (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff58);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&stack0xffffffffffffff58);
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_58.n = (Number)0x0;
    local_58.s.str = (Ch *)0x0;
    local_38 = 0;
    uVar2 = 0;
    std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::operator[]
              ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)(in_RDI + 0xa0),0);
    this_00 = Pool::url((Pool *)0x23c65b);
    pcVar1 = String::data(this_00);
    this_01 = &local_58;
    snprintf((char *)this_01,0x28,"stratum+ssl://%s",pcVar1);
    rapidjson::GenericStringRef<char>::GenericStringRef<4u>(&local_68,(char (*) [4])0x27c136);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&this_01->s,(Ch *)CONCAT44(uVar2,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff20);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_ffffffffffffff60,
              (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff58);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_78);
  }
  return;
}

Assistant:

void xmrig::DonateStrategy::onLogin(IClient *, rapidjson::Document &doc, rapidjson::Value &params)
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

#   ifdef XMRIG_FEATURE_TLS
    if (m_tls) {
        char buf[40] = { 0 };
        snprintf(buf, sizeof(buf), "stratum+ssl://%s", m_pools[0].url().data());
        params.AddMember("url", Value(buf, allocator), allocator);
    }
    else {
        params.AddMember("url", m_pools[1].url().toJSON(), allocator);
    }
#   else
    params.AddMember("url", m_pools[0].url().toJSON(), allocator);
#   endif

}